

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

xmlChar * htmlParseHTMLName(htmlParserCtxtPtr ctxt)

{
  bool bVar1;
  xmlChar local_88 [8];
  xmlChar loc [100];
  int local_1c;
  int i;
  htmlParserCtxtPtr ctxt_local;
  
  local_1c = 0;
  if ((((*ctxt->input->cur < 0x41) || (0x5a < *ctxt->input->cur)) &&
      ((*ctxt->input->cur < 0x61 || (0x7a < *ctxt->input->cur)))) &&
     (((*ctxt->input->cur != '_' && (*ctxt->input->cur != ':')) && (*ctxt->input->cur != '.')))) {
    ctxt_local = (htmlParserCtxtPtr)0x0;
  }
  else {
    while( true ) {
      bVar1 = false;
      if (((local_1c < 100) &&
          ((*ctxt->input->cur < 0x41 || (bVar1 = true, 0x5a < *ctxt->input->cur)))) &&
         ((((*ctxt->input->cur < 0x61 || (bVar1 = true, 0x7a < *ctxt->input->cur)) &&
           (((*ctxt->input->cur < 0x30 || (bVar1 = true, 0x39 < *ctxt->input->cur)) &&
            (bVar1 = true, *ctxt->input->cur != ':')))) &&
          ((bVar1 = true, *ctxt->input->cur != '-' && (bVar1 = true, *ctxt->input->cur != '_'))))))
      {
        bVar1 = *ctxt->input->cur == '.';
      }
      if (!bVar1) break;
      if ((*ctxt->input->cur < 0x41) || (0x5a < *ctxt->input->cur)) {
        local_88[local_1c] = *ctxt->input->cur;
      }
      else {
        local_88[local_1c] = *ctxt->input->cur + ' ';
      }
      local_1c = local_1c + 1;
      xmlNextChar(ctxt);
    }
    ctxt_local = (htmlParserCtxtPtr)xmlDictLookup(ctxt->dict,local_88,local_1c);
  }
  return (xmlChar *)ctxt_local;
}

Assistant:

static const xmlChar *
htmlParseHTMLName(htmlParserCtxtPtr ctxt) {
    int i = 0;
    xmlChar loc[HTML_PARSER_BUFFER_SIZE];

    if (!IS_ASCII_LETTER(CUR) && (CUR != '_') &&
        (CUR != ':') && (CUR != '.')) return(NULL);

    while ((i < HTML_PARSER_BUFFER_SIZE) &&
           ((IS_ASCII_LETTER(CUR)) || (IS_ASCII_DIGIT(CUR)) ||
	   (CUR == ':') || (CUR == '-') || (CUR == '_') ||
           (CUR == '.'))) {
	if ((CUR >= 'A') && (CUR <= 'Z')) loc[i] = CUR + 0x20;
        else loc[i] = CUR;
	i++;

	NEXT;
    }

    return(xmlDictLookup(ctxt->dict, loc, i));
}